

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_dsp.c
# Opt level: O2

uint64_t SharpYuvUpdateY_C(uint16_t *ref,uint16_t *src,uint16_t *dst,int len,int bit_depth)

{
  uint uVar1;
  int iVar2;
  uint64_t uVar3;
  uint uVar4;
  uint16_t uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  uVar6 = ~(-1 << ((byte)bit_depth & 0x1f));
  if (len < 1) {
    len = 0;
  }
  uVar3 = 0;
  for (uVar7 = 0; (uint)len != uVar7; uVar7 = uVar7 + 1) {
    iVar8 = (uint)ref[uVar7] - (uint)src[uVar7];
    uVar4 = (uint)dst[uVar7] + iVar8;
    uVar1 = uVar6;
    if ((int)uVar4 < (int)uVar6) {
      uVar1 = uVar4;
    }
    uVar5 = (uint16_t)uVar1;
    if ((int)uVar4 < 0) {
      uVar5 = 0;
    }
    iVar2 = -iVar8;
    if (0 < iVar8) {
      iVar2 = iVar8;
    }
    dst[uVar7] = uVar5;
    uVar3 = uVar3 + (ushort)iVar2;
  }
  return uVar3;
}

Assistant:

static uint64_t SharpYuvUpdateY_C(const uint16_t* ref, const uint16_t* src,
                                  uint16_t* dst, int len, int bit_depth) {
  uint64_t diff = 0;
  int i;
  const int max_y = (1 << bit_depth) - 1;
  for (i = 0; i < len; ++i) {
    const int diff_y = ref[i] - src[i];
    const int new_y = (int)dst[i] + diff_y;
    dst[i] = clip(new_y, max_y);
    diff += (uint64_t)abs(diff_y);
  }
  return diff;
}